

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::GenerateNewReflectiveServiceMethod
          (ImmutableServiceGenerator *this,Printer *printer)

{
  long lVar1;
  ServiceDescriptor *pSVar2;
  MethodDescriptor *method;
  long lVar3;
  long lVar4;
  string local_50;
  
  io::Printer::Print(printer,
                     "public static com.google.protobuf.Service newReflectiveService(\n    final Interface impl) {\n  return new $classname$() {\n"
                     ,"classname",*(string **)(this->super_ServiceGenerator).descriptor_);
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  pSVar2 = (this->super_ServiceGenerator).descriptor_;
  if (0 < *(int *)(pSVar2 + 0x20)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      lVar1 = *(long *)(pSVar2 + 0x28);
      io::Printer::Print(printer,"@java.lang.Override\n");
      GenerateMethodSignature(this,printer,(MethodDescriptor *)(lVar1 + lVar4),IS_CONCRETE);
      UnderscoresToCamelCase_abi_cxx11_(&local_50,(java *)(lVar1 + lVar4),method);
      io::Printer::Print(printer," {\n  impl.$method$(controller, request, done);\n}\n\n","method",
                         &local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar3 = lVar3 + 1;
      pSVar2 = (this->super_ServiceGenerator).descriptor_;
      lVar4 = lVar4 + 0x68;
    } while (lVar3 < *(int *)(pSVar2 + 0x20));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"};\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateNewReflectiveServiceMethod(
    io::Printer* printer) {
  printer->Print(
    "public static com.google.protobuf.Service newReflectiveService(\n"
    "    final Interface impl) {\n"
    "  return new $classname$() {\n",
    "classname", descriptor_->name());
  printer->Indent();
  printer->Indent();

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    printer->Print("@java.lang.Override\n");
    GenerateMethodSignature(printer, method, IS_CONCRETE);
    printer->Print(
      " {\n"
      "  impl.$method$(controller, request, done);\n"
      "}\n\n",
      "method", UnderscoresToCamelCase(method));
  }

  printer->Outdent();
  printer->Print("};\n");
  printer->Outdent();
  printer->Print("}\n\n");
}